

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLcode unfold_value(Curl_easy *data,char *value,size_t vlen)

{
  Curl_header_store *e;
  char *pcVar1;
  size_t sVar2;
  Curl_header_store *ne;
  bool bVar3;
  size_t offset;
  size_t oalloc;
  size_t olen;
  Curl_header_store *newhs;
  Curl_header_store *hs;
  size_t vlen_local;
  char *value_local;
  Curl_easy *data_local;
  
  e = (data->state).prevhead;
  sVar2 = strlen(e->value);
  pcVar1 = e->value;
  hs = (Curl_header_store *)vlen;
  while( true ) {
    bVar3 = false;
    if ((((hs != (Curl_header_store *)0x0) && (bVar3 = true, value[(long)&hs[-1].field_0x37] != ' ')
         ) && (bVar3 = true, value[(long)&hs[-1].field_0x37] != '\t')) &&
       (bVar3 = false, '\t' < value[(long)&hs[-1].field_0x37])) {
      bVar3 = value[(long)&hs[-1].field_0x37] < '\x0e';
    }
    vlen_local = (size_t)value;
    if (!bVar3) break;
    hs = (Curl_header_store *)&hs[-1].field_0x37;
  }
  while( true ) {
    bVar3 = false;
    if ((((Curl_header_store *)0x1 < hs) &&
        ((*(char *)vlen_local == ' ' || (bVar3 = false, *(char *)vlen_local == '\t')))) &&
       (bVar3 = true, *(char *)(vlen_local + 1) != ' ')) {
      bVar3 = *(char *)(vlen_local + 1) == '\t';
    }
    if (!bVar3) break;
    hs = (Curl_header_store *)&hs[-1].field_0x37;
    vlen_local = vlen_local + 1;
  }
  Curl_node_remove(&e->node);
  ne = (Curl_header_store *)
       Curl_saferealloc(e,(size_t)(pcVar1 + (sVar2 - (long)e->buffer) + 0x3a +
                                  (long)(hs->buffer + -0x35)));
  if (ne == (Curl_header_store *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    ne->name = ne->buffer;
    ne->value = pcVar1 + (0x35 - (long)e->buffer) + (long)(ne->buffer + -0x35);
    memcpy(ne->value + sVar2,(void *)vlen_local,(size_t)hs);
    ne->value[(long)(hs->buffer + (sVar2 - 0x35))] = '\0';
    Curl_llist_append(&(data->state).httphdrs,ne,(Curl_llist_node *)ne);
    (data->state).prevhead = ne;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode unfold_value(struct Curl_easy *data, const char *value,
                             size_t vlen)  /* length of the incoming header */
{
  struct Curl_header_store *hs;
  struct Curl_header_store *newhs;
  size_t olen; /* length of the old value */
  size_t oalloc; /* length of the old name + value + separator */
  size_t offset;
  DEBUGASSERT(data->state.prevhead);
  hs = data->state.prevhead;
  olen = strlen(hs->value);
  offset = hs->value - hs->buffer;
  oalloc = olen + offset + 1;

  /* skip all trailing space letters */
  while(vlen && ISSPACE(value[vlen - 1]))
    vlen--;

  /* save only one leading space */
  while((vlen > 1) && ISBLANK(value[0]) && ISBLANK(value[1])) {
    vlen--;
    value++;
  }

  /* since this header block might move in the realloc below, it needs to
     first be unlinked from the list and then re-added again after the
     realloc */
  Curl_node_remove(&hs->node);

  /* new size = struct + new value length + old name+value length */
  newhs = Curl_saferealloc(hs, sizeof(*hs) + vlen + oalloc + 1);
  if(!newhs)
    return CURLE_OUT_OF_MEMORY;
  /* ->name and ->value point into ->buffer (to keep the header allocation
     in a single memory block), which now potentially have moved. Adjust
     them. */
  newhs->name = newhs->buffer;
  newhs->value = &newhs->buffer[offset];

  /* put the data at the end of the previous data, not the newline */
  memcpy(&newhs->value[olen], value, vlen);
  newhs->value[olen + vlen] = 0; /* null-terminate at newline */

  /* insert this node into the list of headers */
  Curl_llist_append(&data->state.httphdrs, newhs, &newhs->node);
  data->state.prevhead = newhs;
  return CURLE_OK;
}